

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O2

void Eigen::internal::general_matrix_matrix_product<long,_double,_1,_false,_double,_1,_false,_0>::
     run(long rows,long cols,long depth,double *_lhs,long lhsStride,double *_rhs,long rhsStride,
        ResScalar *_res,long resStride,ResScalar alpha,level3_blocking<double,_double> *blocking,
        GemmParallelInfo<long> *info)

{
  long lVar1;
  ulong size;
  size_t size_00;
  long lVar2;
  RhsScalar *pRVar3;
  long lVar4;
  LhsScalar *pLVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  LhsScalar *pLVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  undefined1 local_138 [8];
  aligned_stack_memory_handler<double> blockA_stack_memory_destructor;
  aligned_stack_memory_handler<double> blockB_stack_memory_destructor;
  double *local_88;
  blas_data_mapper<double,_long,_0,_0> local_68;
  RhsScalar *local_58;
  long local_50;
  LhsScalar *local_48;
  double *local_40;
  gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_2,_1,_false,_false>
  local_35;
  gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_1,_false,_false>
  local_34;
  gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
  local_33;
  byte local_32;
  bool local_31;
  gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_2,_1,_false,_false>
  pack_lhs;
  gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_1,_false,_false>
  pack_rhs;
  gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
  gebp;
  
  pLVar12 = (LhsScalar *)local_138;
  lVar2 = blocking->m_kc;
  local_40 = (double *)blocking->m_mc;
  lVar6 = blocking->m_nc;
  pdVar9 = (double *)rows;
  if ((long)local_40 < rows) {
    pdVar9 = local_40;
  }
  local_50 = cols;
  if (lVar6 < cols) {
    local_50 = lVar6;
  }
  pdVar10 = (double *)((long)pdVar9 * lVar2);
  if ((ulong)pdVar10 >> 0x3d != 0) {
    throw_std_bad_alloc();
  }
  uVar18 = local_50 * lVar2;
  size = (long)pdVar10 * 8;
  local_48 = blocking->m_blockA;
  if (blocking->m_blockA == (LhsScalar *)0x0) {
    if (size < 0x20001) {
      local_138 = (undefined1  [8])(local_138 + -(size + 0x1e & 0xfffffffffffffff0));
      blockA_stack_memory_destructor.m_size._0_1_ = false;
      local_48 = (LhsScalar *)local_138;
      pLVar12 = (LhsScalar *)local_138;
    }
    else {
      local_48 = (LhsScalar *)aligned_malloc(size);
      local_138 = (undefined1  [8])(LhsScalar *)0x0;
      if (blocking->m_blockA == (LhsScalar *)0x0) {
        local_138 = (undefined1  [8])local_48;
      }
      blockA_stack_memory_destructor.m_size._0_1_ = true;
    }
  }
  else {
    blockA_stack_memory_destructor.m_size._0_1_ = 0x20000 < size;
    local_138 = (undefined1  [8])0x0;
    pLVar12 = (LhsScalar *)local_138;
  }
  blockA_stack_memory_destructor.m_ptr = pdVar10;
  if (0x1fffffffffffffff < uVar18) {
    pLVar12[-1] = 5.77543471428229e-318;
    throw_std_bad_alloc();
  }
  size_00 = uVar18 * 8;
  if (blocking->m_blockB == (RhsScalar *)0x0) {
    if (size_00 < 0x20001) {
      pLVar12 = (LhsScalar *)((long)pLVar12 - (size_00 + 0x1e & 0xfffffffffffffff0));
      local_58 = pLVar12;
      blockA_stack_memory_destructor._16_8_ = pLVar12;
    }
    else {
      pLVar12[-1] = 5.77577067892147e-318;
      local_58 = (RhsScalar *)aligned_malloc(size_00);
      blockA_stack_memory_destructor._16_8_ = (RhsScalar *)0x0;
      if (blocking->m_blockB == (RhsScalar *)0x0) {
        blockA_stack_memory_destructor._16_8_ = local_58;
      }
    }
  }
  else {
    local_58 = blocking->m_blockB;
    blockA_stack_memory_destructor._16_8_ = (RhsScalar *)0x0;
  }
  lVar4 = local_50;
  local_88 = _res;
  local_31 = (lVar2 != depth || rows <= (long)local_40) || lVar6 < cols;
  lVar13 = resStride * local_50;
  lVar6 = 0;
  while (lVar6 < rows) {
    lVar7 = (long)pdVar9 + lVar6;
    lVar8 = rows;
    if (lVar7 < rows) {
      lVar8 = lVar7;
    }
    local_32 = lVar6 == 0 | local_31;
    lVar16 = 0;
    pdVar10 = _rhs;
    while (pLVar5 = local_48, lVar16 < depth) {
      lVar1 = lVar16 + lVar2;
      lVar14 = depth;
      if (lVar1 < depth) {
        lVar14 = lVar1;
      }
      lVar14 = lVar14 - lVar16;
      local_68.m_data = _lhs + lVar6 * lhsStride + lVar16;
      local_68.m_stride = lhsStride;
      pLVar12[-2] = 0.0;
      pLVar12[-3] = 5.7775838998417e-318;
      gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_2,_1,_false,_false>
      ::operator()(&local_35,pLVar5,(const_blas_data_mapper<double,_long,_1> *)&local_68,lVar14,
                   lVar8 - lVar6,0,(long)pLVar12[-2]);
      lVar15 = 0;
      local_40 = pdVar10;
      lVar19 = 0;
      pdVar11 = local_88;
      lVar16 = local_50;
      while( true ) {
        pRVar3 = local_58;
        lVar17 = lVar16;
        if (cols < lVar16) {
          lVar17 = cols;
        }
        if (cols <= lVar19) break;
        if (local_32 != 0) {
          local_68.m_data = local_40;
          local_68.m_stride = rhsStride;
          pLVar12[-2] = 0.0;
          pLVar12[-3] = 5.77818171927317e-318;
          gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_1,_false,_false>
          ::operator()(&local_34,pRVar3,(const_blas_data_mapper<double,_long,_1> *)&local_68,lVar14,
                       lVar17 + lVar15,0,(long)pLVar12[-2]);
        }
        local_68.m_data = pdVar11;
        local_68.m_stride = resStride;
        pLVar12[-3] = 0.0;
        pLVar12[-2] = 0.0;
        pLVar12[-4] = -NAN;
        pLVar12[-5] = -NAN;
        pLVar12[-6] = (LhsScalar)(lVar17 + lVar15);
        pLVar5 = local_48;
        pRVar3 = local_58;
        pLVar12[-7] = 5.77860167507214e-318;
        gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
        ::operator()(&local_33,&local_68,pLVar5,pRVar3,lVar8 - lVar6,lVar14,(long)pLVar12[-6],alpha,
                     (long)pLVar12[-5],(long)pLVar12[-4],(long)pLVar12[-3],(long)pLVar12[-2]);
        lVar19 = lVar19 + local_50;
        local_40 = local_40 + lVar4;
        pdVar11 = pdVar11 + lVar13;
        lVar16 = lVar16 + local_50;
        lVar15 = lVar15 - local_50;
      }
      pdVar10 = pdVar10 + lVar2 * rhsStride;
      lVar16 = lVar1;
    }
    local_88 = local_88 + (long)pdVar9;
    lVar6 = lVar7;
  }
  pLVar12[-1] = 5.77917479122131e-318;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&blockA_stack_memory_destructor.m_deallocate);
  pLVar12[-1] = 5.77923407909881e-318;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_138);
  return;
}

Assistant:

static void run(Index rows, Index cols, Index depth,
  const LhsScalar* _lhs, Index lhsStride,
  const RhsScalar* _rhs, Index rhsStride,
  ResScalar* _res, Index resStride,
  ResScalar alpha,
  level3_blocking<LhsScalar,RhsScalar>& blocking,
  GemmParallelInfo<Index>* info = 0)
{
  typedef const_blas_data_mapper<LhsScalar, Index, LhsStorageOrder> LhsMapper;
  typedef const_blas_data_mapper<RhsScalar, Index, RhsStorageOrder> RhsMapper;
  typedef blas_data_mapper<typename Traits::ResScalar, Index, ColMajor> ResMapper;
  LhsMapper lhs(_lhs,lhsStride);
  RhsMapper rhs(_rhs,rhsStride);
  ResMapper res(_res, resStride);

  Index kc = blocking.kc();                   // cache block size along the K direction
  Index mc = (std::min)(rows,blocking.mc());  // cache block size along the M direction
  Index nc = (std::min)(cols,blocking.nc());  // cache block size along the N direction

  gemm_pack_lhs<LhsScalar, Index, LhsMapper, Traits::mr, Traits::LhsProgress, LhsStorageOrder> pack_lhs;
  gemm_pack_rhs<RhsScalar, Index, RhsMapper, Traits::nr, RhsStorageOrder> pack_rhs;
  gebp_kernel<LhsScalar, RhsScalar, Index, ResMapper, Traits::mr, Traits::nr, ConjugateLhs, ConjugateRhs> gebp;

#ifdef EIGEN_HAS_OPENMP
  if(info)
  {
    // this is the parallel version!
    int tid = omp_get_thread_num();
    int threads = omp_get_num_threads();

    LhsScalar* blockA = blocking.blockA();
    eigen_internal_assert(blockA!=0);

    std::size_t sizeB = kc*nc;
    ei_declare_aligned_stack_constructed_variable(RhsScalar, blockB, sizeB, 0);

    // For each horizontal panel of the rhs, and corresponding vertical panel of the lhs...
    for(Index k=0; k<depth; k+=kc)
    {
      const Index actual_kc = (std::min)(k+kc,depth)-k; // => rows of B', and cols of the A'

      // In order to reduce the chance that a thread has to wait for the other,
      // let's start by packing B'.
      pack_rhs(blockB, rhs.getSubMapper(k,0), actual_kc, nc);

      // Pack A_k to A' in a parallel fashion:
      // each thread packs the sub block A_k,i to A'_i where i is the thread id.

      // However, before copying to A'_i, we have to make sure that no other thread is still using it,
      // i.e., we test that info[tid].users equals 0.
      // Then, we set info[tid].users to the number of threads to mark that all other threads are going to use it.
      while(info[tid].users!=0) {}
      info[tid].users += threads;

      pack_lhs(blockA+info[tid].lhs_start*actual_kc, lhs.getSubMapper(info[tid].lhs_start,k), actual_kc, info[tid].lhs_length);

      // Notify the other threads that the part A'_i is ready to go.
      info[tid].sync = k;

      // Computes C_i += A' * B' per A'_i
      for(int shift=0; shift<threads; ++shift)
      {
        int i = (tid+shift)%threads;

        // At this point we have to make sure that A'_i has been updated by the thread i,
        // we use testAndSetOrdered to mimic a volatile access.
        // However, no need to wait for the B' part which has been updated by the current thread!
        if (shift>0) {
          while(info[i].sync!=k) {
          }
        }

        gebp(res.getSubMapper(info[i].lhs_start, 0), blockA+info[i].lhs_start*actual_kc, blockB, info[i].lhs_length, actual_kc, nc, alpha);
      }

      // Then keep going as usual with the remaining B'
      for(Index j=nc; j<cols; j+=nc)
      {
        const Index actual_nc = (std::min)(j+nc,cols)-j;

        // pack B_k,j to B'
        pack_rhs(blockB, rhs.getSubMapper(k,j), actual_kc, actual_nc);

        // C_j += A' * B'
        gebp(res.getSubMapper(0, j), blockA, blockB, rows, actual_kc, actual_nc, alpha);
      }

      // Release all the sub blocks A'_i of A' for the current thread,
      // i.e., we simply decrement the number of users by 1
      for(Index i=0; i<threads; ++i)
        #pragma omp atomic
        info[i].users -= 1;
    }
  }
  else
#endif // EIGEN_HAS_OPENMP
  {
    EIGEN_UNUSED_VARIABLE(info);

    // this is the sequential version!
    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*nc;

    ei_declare_aligned_stack_constructed_variable(LhsScalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(RhsScalar, blockB, sizeB, blocking.blockB());

    const bool pack_rhs_once = mc!=rows && kc==depth && nc==cols;

    // For each horizontal panel of the rhs, and corresponding panel of the lhs...
    for(Index i2=0; i2<rows; i2+=mc)
    {
      const Index actual_mc = (std::min)(i2+mc,rows)-i2;

      for(Index k2=0; k2<depth; k2+=kc)
      {
        const Index actual_kc = (std::min)(k2+kc,depth)-k2;

        // OK, here we have selected one horizontal panel of rhs and one vertical panel of lhs.
        // => Pack lhs's panel into a sequential chunk of memory (L2/L3 caching)
        // Note that this panel will be read as many times as the number of blocks in the rhs's
        // horizontal panel which is, in practice, a very low number.
        pack_lhs(blockA, lhs.getSubMapper(i2,k2), actual_kc, actual_mc);

        // For each kc x nc block of the rhs's horizontal panel...
        for(Index j2=0; j2<cols; j2+=nc)
        {
          const Index actual_nc = (std::min)(j2+nc,cols)-j2;

          // We pack the rhs's block into a sequential chunk of memory (L2 caching)
          // Note that this block will be read a very high number of times, which is equal to the number of
          // micro horizontal panel of the large rhs's panel (e.g., rows/12 times).
          if((!pack_rhs_once) || i2==0)
            pack_rhs(blockB, rhs.getSubMapper(k2,j2), actual_kc, actual_nc);

          // Everything is packed, we can now call the panel * block kernel:
          gebp(res.getSubMapper(i2, j2), blockA, blockB, actual_mc, actual_kc, actual_nc, alpha);
        }
      }
    }
  }
}